

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<capnp::DynamicList::Reader&>(StringTree *__return_storage_ptr__,kj *this,Reader *params)

{
  StringTree SStack_48;
  
  capnp::operator*(&SStack_48);
  StringTree::StringTree(__return_storage_ptr__,&SStack_48);
  StringTree::~StringTree(&SStack_48);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}